

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Texture>::
removeGarbageUntilUnder
          (GLObjectManager<deqp::gls::LongStressCaseInternal::Texture> *this,int limit,Random *rnd)

{
  int iVar1;
  int iVar2;
  InternalError *this_00;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = computeApproxMemUsage(this);
  do {
    if (iVar1 <= limit) {
      return;
    }
    iVar2 = removeRandomGarbage(this,rnd);
    iVar1 = iVar1 - iVar2;
  } while (-1 < iVar2);
  this_00 = (InternalError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,glcts::fixed_sample_locations_values + 1,&local_e1);
  std::operator+(&local_c0,&local_e0,"Given ");
  std::operator+(&local_a0,&local_c0,"texture");
  std::operator+(&local_80,&local_a0," memory usage limit exceeded, and no unneeded ");
  std::operator+(&local_60,&local_80,"texture");
  std::operator+(&local_40,&local_60," resources available to release");
  tcu::InternalError::InternalError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLObjectManager<T>::removeGarbageUntilUnder (const int limit, Random& rnd)
{
	int memUsage = computeApproxMemUsage();

	while (memUsage > limit)
	{
		const int memReleased = removeRandomGarbage(rnd);
		if (memReleased < 0)
			throw tcu::InternalError(string("") + "Given " + objTypeName() + " memory usage limit exceeded, and no unneeded " + objTypeName() + " resources available to release");
		memUsage -= memReleased;
		DE_ASSERT(memUsage == computeApproxMemUsage());
	}
}